

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O0

bool __thiscall USDFParser::ParseIfItem(USDFParser *this,FStrifeDialogueNode *node)

{
  bool bVar1;
  int iVar2;
  PClassActor *p;
  char *pcVar3;
  undefined1 local_2c [8];
  FName key;
  FStrifeDialogueItemCheck check;
  FStrifeDialogueNode *node_local;
  USDFParser *this_local;
  
  stack0xffffffffffffffd8 = (PClassInventory *)0x0;
  while (bVar1 = FScanner::CheckToken((FScanner *)this,0x7d), ((bVar1 ^ 0xffU) & 1) != 0) {
    UDMFParserBase::ParseKey((UDMFParserBase *)local_2c,SUB81(this,0),(bool *)0x0);
    iVar2 = FName::operator_cast_to_int((FName *)local_2c);
    if (iVar2 == 0x29) {
      pcVar3 = FName::operator_cast_to_char_((FName *)local_2c);
      p = CheckActorType(this,pcVar3);
      register0x00000000 = dyn_cast<PClassInventory>((DObject *)p);
    }
    else if (iVar2 == 0x1e9) {
      pcVar3 = FName::operator_cast_to_char_((FName *)local_2c);
      UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar3);
    }
  }
  TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Push
            (&node->ItemCheck,(FStrifeDialogueItemCheck *)(local_2c + 4));
  return true;
}

Assistant:

bool ParseIfItem(FStrifeDialogueNode *node)
	{
		FStrifeDialogueItemCheck check;
		check.Item = NULL;
		check.Amount = -1;

		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Item:
				check.Item = dyn_cast<PClassInventory>(CheckActorType(key));
				break;

			case NAME_Count:
				// Not yet implemented in the engine. Todo later
				check.Amount = CheckInt(key);
				break;
			}
		}

		node->ItemCheck.Push(check);
		return true;
	}